

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

void VW::sync_stats(vw *all)

{
  long *in_RDI;
  float fVar1;
  float total_features;
  float example_number;
  float weighted_unlabeled_examples;
  float weighted_labels;
  float weighted_labeled_examples;
  float loss;
  float in_stack_ffffffffffffffcc;
  float fVar2;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  if (in_RDI[4] != 0) {
    fVar1 = accumulate_scalar((vw *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                              in_stack_ffffffffffffffcc);
    *(double *)(*in_RDI + 0x40) = (double)fVar1;
    fVar1 = accumulate_scalar((vw *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                              in_stack_ffffffffffffffcc);
    *(double *)(*in_RDI + 0x20) = (double)fVar1;
    fVar1 = accumulate_scalar((vw *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                              in_stack_ffffffffffffffcc);
    *(double *)(*in_RDI + 0x38) = (double)fVar1;
    fVar1 = accumulate_scalar((vw *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                              in_stack_ffffffffffffffcc);
    *(double *)(*in_RDI + 0x30) = (double)fVar1;
    fVar1 = accumulate_scalar((vw *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                              in_stack_ffffffffffffffcc);
    fVar2 = 9.223372e+18;
    *(long *)(*in_RDI + 8) = (long)fVar1 | (long)(fVar1 - 9.223372e+18) & (long)fVar1 >> 0x3f;
    fVar1 = accumulate_scalar((vw *)CONCAT44((float)*(ulong *)(*in_RDI + 0x10),
                                             (float)(long)*(ulong *)(*in_RDI + 0x10)),9.223372e+18);
    *(long *)(*in_RDI + 0x10) = (long)fVar1 | (long)(fVar1 - fVar2) & (long)fVar1 >> 0x3f;
  }
  return;
}

Assistant:

void sync_stats(vw& all)
{
  if (all.all_reduce != nullptr)
  {
    float loss = (float)all.sd->sum_loss;
    all.sd->sum_loss = (double)accumulate_scalar(all, loss);
    float weighted_labeled_examples = (float)all.sd->weighted_labeled_examples;
    all.sd->weighted_labeled_examples = (double)accumulate_scalar(all, weighted_labeled_examples);
    float weighted_labels = (float)all.sd->weighted_labels;
    all.sd->weighted_labels = (double)accumulate_scalar(all, weighted_labels);
    float weighted_unlabeled_examples = (float)all.sd->weighted_unlabeled_examples;
    all.sd->weighted_unlabeled_examples = (double)accumulate_scalar(all, weighted_unlabeled_examples);
    float example_number = (float)all.sd->example_number;
    all.sd->example_number = (uint64_t)accumulate_scalar(all, example_number);
    float total_features = (float)all.sd->total_features;
    all.sd->total_features = (uint64_t)accumulate_scalar(all, total_features);
  }
}